

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDFacePtr __thiscall ON_SubDEdge::FacePtrFromFace(ON_SubDEdge *this,ON_SubDFace *f)

{
  ON_SubDFacePtr *pOVar1;
  bool bVar2;
  ulong in_RAX;
  ON_SubDFacePtr *pOVar3;
  uint uVar4;
  
  if (f != (ON_SubDFace *)0x0) {
    bVar2 = true;
    if (this->m_face_count != 0) {
      pOVar1 = this->m_facex;
      pOVar3 = this->m_face2;
      uVar4 = 0;
      do {
        in_RAX = CONCAT71((int7)(in_RAX >> 8),pOVar1 != (ON_SubDFacePtr *)0x0);
        if (uVar4 == 2) {
          pOVar3 = pOVar1;
        }
        if (uVar4 == 2 && pOVar1 == (ON_SubDFacePtr *)0x0) break;
        in_RAX = pOVar3->m_ptr;
        if ((ON_SubDFace *)(in_RAX & 0xfffffffffffffff8) == f) {
          bVar2 = false;
          break;
        }
        uVar4 = uVar4 + 1;
        pOVar3 = pOVar3 + 1;
      } while (this->m_face_count != uVar4);
    }
    if (!bVar2) {
      return (ON_SubDFacePtr)in_RAX;
    }
  }
  return (ON_SubDFacePtr)0;
}

Assistant:

const ON_SubDFacePtr ON_SubDEdge::FacePtrFromFace(
  const class ON_SubDFace* f
) const
{
  if (nullptr != f)
  {
    const ON_SubDFacePtr* fptr = m_face2;
    const unsigned int edge_face_count = m_face_count;
    for (unsigned int efi = 0; efi < edge_face_count; efi++, fptr++)
    {
      if (2 == efi)
      {
        fptr = m_facex;
        if (nullptr == fptr)
          break;
      }
      if (fptr->Face() == f)
        return *fptr;
    }
  }
  return ON_SubDFacePtr::Null;
}